

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CS248::Collada::ColladaParser::parse_camera(XMLElement *xml,CameraInfo *camera)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  char *pcVar4;
  XMLElement *pXVar5;
  undefined4 *in_RSI;
  float aspect_ratio;
  XMLElement *e_aspect_ratio;
  XMLElement *e_zfar;
  XMLElement *e_znear;
  XMLElement *e_yfov;
  XMLElement *e_xfov;
  XMLElement *e_perspective;
  string *in_stack_00000148;
  XMLElement *in_stack_00000150;
  XMLElement *in_stack_fffffffffffffee8;
  XMLNode *in_stack_fffffffffffffef0;
  XMLElement *in_stack_fffffffffffffef8;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  allocator local_b1;
  string local_b0 [32];
  XMLElement *local_90;
  XMLElement *local_88;
  XMLElement *local_80;
  XMLElement *local_78;
  XMLElement *local_70;
  allocator local_51;
  string local_50 [32];
  XMLElement *local_30;
  Vector3D local_28;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  pcVar4 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                      (char *)in_stack_fffffffffffffee8);
  std::__cxx11::string::operator=((string *)(local_10 + 2),pcVar4);
  pcVar4 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                      (char *)in_stack_fffffffffffffee8);
  std::__cxx11::string::operator=((string *)(local_10 + 10),pcVar4);
  *local_10 = 0;
  *(undefined8 *)(local_10 + 0x1c) = up._16_8_;
  uVar3 = up._8_8_;
  *(undefined8 *)(local_10 + 0x18) = up._0_8_;
  *(undefined8 *)(local_10 + 0x1a) = uVar3;
  Vector3D::Vector3D(&local_28,0.0,0.0,-1.0);
  *(double *)(local_10 + 0x16) = local_28.z;
  *(double *)(local_10 + 0x12) = local_28.x;
  *(double *)(local_10 + 0x14) = local_28.y;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"optics/technique_common/perspective",&local_51);
  pXVar5 = get_element(in_stack_00000150,in_stack_00000148);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pXVar5;
  if (pXVar5 == (XMLElement *)0x0) {
    exit(1);
  }
  local_70 = tinyxml2::XMLNode::FirstChildElement
                       (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  local_78 = tinyxml2::XMLNode::FirstChildElement
                       (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  local_80 = tinyxml2::XMLNode::FirstChildElement
                       (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  local_88 = tinyxml2::XMLNode::FirstChildElement
                       (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  if (local_70 == (XMLElement *)0x0) {
    local_e0 = 50.0;
  }
  else {
    pcVar4 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffffee8);
    local_e0 = atof(pcVar4);
  }
  local_10[0x1e] = (float)local_e0;
  if (local_78 == (XMLElement *)0x0) {
    local_e8 = 35.0;
  }
  else {
    pcVar4 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffffee8);
    local_e8 = atof(pcVar4);
  }
  local_10[0x1f] = (float)local_e8;
  if (local_80 == (XMLElement *)0x0) {
    local_f0 = 0.0010000000474974513;
  }
  else {
    pcVar4 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffffee8);
    local_f0 = atof(pcVar4);
  }
  local_10[0x20] = (float)local_f0;
  if (local_88 == (XMLElement *)0x0) {
    local_f8 = 1000.0;
  }
  else {
    pcVar4 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffffee8);
    local_f8 = atof(pcVar4);
  }
  local_10[0x21] = (float)local_f8;
  if (local_78 == (XMLElement *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"aspect_ratio",&local_b1);
    pXVar5 = get_element(in_stack_00000150,in_stack_00000148);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    local_90 = pXVar5;
    if (pXVar5 == (XMLElement *)0x0) {
      exit(1);
    }
    pcVar4 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffffee8);
    dVar1 = atof(pcVar4);
    dVar2 = radians<double>((double)(float)local_10[0x1e] * 0.5);
    dVar2 = tan(dVar2);
    dVar1 = atan(dVar2 / (double)(float)dVar1);
    dVar1 = degrees<double>(dVar1);
    local_10[0x1f] = (float)(dVar1 * 2.0);
  }
  return;
}

Assistant:

void ColladaParser::parse_camera(XMLElement* xml, CameraInfo& camera) {
  // name & id
  camera.id = xml->Attribute("id");
  camera.name = xml->Attribute("name");
  camera.type = Instance::CAMERA;

  // default look direction is down the up axis
  camera.up_dir = up;
  camera.view_dir = Vector3D(0, 0, -1);

  // NOTE (sky): only supports perspective for now
  XMLElement* e_perspective =
      get_element(xml, "optics/technique_common/perspective");
  if (e_perspective) {
    XMLElement* e_xfov = e_perspective->FirstChildElement("xfov");
    XMLElement* e_yfov = e_perspective->FirstChildElement("yfov");
    XMLElement* e_znear = e_perspective->FirstChildElement("znear");
    XMLElement* e_zfar = e_perspective->FirstChildElement("zfar");

    camera.hFov = e_xfov ? atof(e_xfov->GetText()) : 50.0f;
    camera.vFov = e_yfov ? atof(e_yfov->GetText()) : 35.0f;
    camera.nClip = e_znear ? atof(e_znear->GetText()) : 0.001f;
    camera.fClip = e_zfar ? atof(e_zfar->GetText()) : 1000.0f;

    if (!e_yfov) {  // if vfov is not given, compute from aspect ratio
      XMLElement* e_aspect_ratio = get_element(e_perspective, "aspect_ratio");
      if (e_aspect_ratio) {
        float aspect_ratio = atof(e_aspect_ratio->GetText());
        camera.vFov =
            2 * degrees(atan(tan(radians(0.5 * camera.hFov)) / aspect_ratio));
      } else {
        stat("Error: incomplete perspective definition in: " << camera.id);
        exit(EXIT_FAILURE);
      }
    }
  } else {
    stat("Error: no perspective defined in camera: " << camera.id);
    exit(EXIT_FAILURE);
  }

  // print summary
  stat("  |- " << camera);
}